

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ef7149::HighBDConvolveScaleTest_DISABLED_Speed_Test::TestBody
          (HighBDConvolveScaleTest_DISABLED_Speed_Test *this)

{
  ostream *poVar1;
  SEARCH_METHODS *message;
  int iVar2;
  bool bVar3;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a0;
  AssertHelper local_98;
  int64_t ref_time;
  AssertionResult gtest_ar;
  int64_t tst_time;
  ACMRandom rnd;
  aom_usec_timer tst_timer;
  aom_usec_timer ref_timer;
  
  rnd.random_.state_ = (Random)0xbaba;
  ConvolveScaleTestBase<unsigned_short>::Prep((ConvolveScaleTestBase<unsigned_short> *)this,&rnd);
  ::aom_usec_timer_start(&ref_timer);
  iVar2 = 1000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    (*(this->super_HighBDConvolveScaleTest).super_ConvolveScaleTestBase<unsigned_short>.super_Test.
      _vptr_Test[6])(this);
  }
  ::aom_usec_timer_mark(&ref_timer);
  ref_time = ::aom_usec_timer_elapsed(&ref_timer);
  ::aom_usec_timer_start(&tst_timer);
  iVar2 = 1000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    (*(this->super_HighBDConvolveScaleTest).super_ConvolveScaleTestBase<unsigned_short>.super_Test.
      _vptr_Test[6])(this,0);
  }
  ::aom_usec_timer_mark(&tst_timer);
  tst_time = ::aom_usec_timer_elapsed(&tst_timer);
  poVar1 = std::operator<<((ostream *)&std::cout,"[          ] C time = ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," ms, SIMD time = ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," ms\n");
  testing::internal::CmpHelperGT<long,long>
            ((internal *)&gtest_ar,"ref_time","tst_time",&ref_time,&tst_time);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    std::operator<<((ostream *)(local_a0._M_head_impl + 0x10),
                    "Error: CDEFSpeedTest, SIMD slower than C.\n");
    std::operator<<((ostream *)(local_a0._M_head_impl + 0x10),"C time: ");
    std::ostream::_M_insert<long>((long)(local_a0._M_head_impl + 0x10));
    std::operator<<((ostream *)(local_a0._M_head_impl + 0x10)," us\n");
    std::operator<<((ostream *)(local_a0._M_head_impl + 0x10),"SIMD time: ");
    std::ostream::_M_insert<long>((long)(local_a0._M_head_impl + 0x10));
    std::operator<<((ostream *)(local_a0._M_head_impl + 0x10)," us\n");
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(SEARCH_METHODS **)
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_scale_test.cc"
               ,0x120,(char *)message);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_a0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a0._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_P(HighBDConvolveScaleTest, DISABLED_Speed) { SpeedTest(); }